

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O1

MDDEntry * __thiscall ASDCP::Dictionary::Type(Dictionary *this,MDD_t type_id)

{
  _Rb_tree_header *p_Var1;
  ILogSink *this_00;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  bool bVar4;
  
  if (*this->m_MDD_Table[0].name != '\0') {
    p_Var1 = &(this->m_md_rev_lookup)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->m_md_rev_lookup)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var1->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[bVar4]) {
      bVar4 = p_Var3[1]._M_color < type_id;
      if (!bVar4) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var3 = p_Var2, type_id < p_Var2[1]._M_color)) {
      p_Var3 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 == p_Var1) {
      this_00 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(this_00,"UL Dictionary: unknown UL type_id: %d\n",(ulong)type_id);
    }
    return this->m_MDD_Table + type_id;
  }
  __assert_fail("m_MDD_Table[0].name[0]",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Dict.cpp"
                ,0x116,"const ASDCP::MDDEntry &ASDCP::Dictionary::Type(MDD_t) const");
}

Assistant:

const ASDCP::MDDEntry&
ASDCP::Dictionary::Type(MDD_t type_id) const
{
  assert(m_MDD_Table[0].name[0]);
  std::map<ui32_t, ASDCP::UL>::const_iterator rii = m_md_rev_lookup.find(type_id);

  if ( rii == m_md_rev_lookup.end() )
    Kumu::DefaultLogSink().Warn("UL Dictionary: unknown UL type_id: %d\n", type_id);

  return m_MDD_Table[type_id];
}